

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  byte *__src;
  long lVar5;
  
  lVar5 = 0;
  __src = (byte *)0x0;
  do {
    pbVar4 = (byte *)s + 3;
    while( true ) {
      bVar1 = pbVar4[-3];
      bVar3 = (anonymous_namespace)::chartype_table[bVar1];
      if ((bVar3 & 4) != 0) break;
      bVar1 = pbVar4[-2];
      bVar3 = (anonymous_namespace)::chartype_table[bVar1];
      if ((bVar3 & 4) != 0) {
        pbVar4 = pbVar4 + -2;
        goto LAB_0015a241;
      }
      bVar1 = pbVar4[-1];
      bVar3 = (anonymous_namespace)::chartype_table[bVar1];
      if ((bVar3 & 4) != 0) {
        pbVar4 = pbVar4 + -1;
        goto LAB_0015a241;
      }
      bVar1 = *pbVar4;
      bVar3 = (anonymous_namespace)::chartype_table[bVar1];
      if ((bVar3 & 4) != 0) goto LAB_0015a241;
      pbVar4 = pbVar4 + 4;
    }
    pbVar4 = pbVar4 + -3;
LAB_0015a241:
    if (bVar1 == end_quote) {
      pbVar2 = pbVar4;
      if (__src != (byte *)0x0) {
        memmove(__src + -lVar5,__src,(long)pbVar4 - (long)__src);
        pbVar2 = pbVar4 + -lVar5;
      }
      *pbVar2 = 0;
      return (char_t *)(pbVar4 + 1);
    }
    if ((bVar3 & 8) == 0) {
      if (bVar1 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(pbVar4 + 1);
    }
    else {
      s = (char_t *)(pbVar4 + 1);
      *pbVar4 = 0x20;
      if ((bVar1 == 0xd) && (*s == 10)) {
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar5,__src,(long)s - (long)__src);
        }
        s = (char_t *)(pbVar4 + 2);
        lVar5 = lVar5 + 1;
        __src = (byte *)s;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}